

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

xmlOutputBufferCreateFilenameFunc
xmlOutputBufferCreateFilenameDefault(xmlOutputBufferCreateFilenameFunc func)

{
  xmlOutputBufferCreateFilenameFunc *pp_Var1;
  xmlOutputBufferCreateFilenameFunc local_18;
  xmlOutputBufferCreateFilenameFunc old;
  xmlOutputBufferCreateFilenameFunc func_local;
  
  pp_Var1 = __xmlOutputBufferCreateFilenameValue();
  local_18 = *pp_Var1;
  if (local_18 == (xmlOutputBufferCreateFilenameFunc)0x0) {
    local_18 = __xmlOutputBufferCreateFilename;
  }
  pp_Var1 = __xmlOutputBufferCreateFilenameValue();
  *pp_Var1 = func;
  return local_18;
}

Assistant:

xmlOutputBufferCreateFilenameFunc
xmlOutputBufferCreateFilenameDefault(xmlOutputBufferCreateFilenameFunc func)
{
    xmlOutputBufferCreateFilenameFunc old = xmlOutputBufferCreateFilenameValue;
#ifdef LIBXML_OUTPUT_ENABLED
    if (old == NULL) {
		old = __xmlOutputBufferCreateFilename;
	}
#endif
    xmlOutputBufferCreateFilenameValue = func;
    return(old);
}